

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3cTestPackage.cpp
# Opt level: O0

int __thiscall es3cts::ES30TestPackage::init(ES30TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  Context *context;
  ES30TestPackage *this_local;
  
  deqp::TestPackage::init(&this->super_TestPackage,ctx);
  node = (TestNode *)operator_new(0x78);
  context = deqp::TestPackage::getContext(&this->super_TestPackage);
  ShaderTests::ShaderTests((ShaderTests *)node,context);
  tcu::TestNode::addChild((TestNode *)this,node);
  return extraout_EAX;
}

Assistant:

void ES30TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	deqp::TestPackage::init();

	try
	{
		addChild(new ShaderTests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		deqp::TestPackage::deinit();
		throw;
	}
}